

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

int calc_offset_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  ushort uVar6;
  Am_Object parent;
  Am_Object prev_child;
  Am_Value_List nodes;
  Am_Object local_40 [8];
  Am_Object local_38 [8];
  Am_Value_List local_30 [16];
  
  uVar6 = (ushort)self;
  pAVar5 = (Am_Value *)Am_Object::Get(uVar6,(ulong)PREV_CHILD);
  Am_Object::Am_Object(local_38,pAVar5);
  cVar1 = Am_Object::Valid();
  if (cVar1 == '\0') {
    pAVar5 = (Am_Value *)Am_Object::Get(uVar6,0x85);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = (Am_Value *)Am_Object::Get(uVar6,(ulong)PARENT);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    iVar3 = 0;
    if (iVar2 != iVar4) {
      Am_Object::Get_Owner(local_40,(Am_Slot_Flags)self);
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_40,0x82);
      Am_Value_List::Am_Value_List(local_30,pAVar5);
      Am_Object::~Am_Object(local_40);
      cVar1 = Am_Value_List::Valid();
      iVar3 = 0;
      if (cVar1 != '\0') {
        pAVar5 = (Am_Value *)Am_Value_List::Get_Nth((int)local_30);
        Am_Object::Am_Object(local_40,pAVar5);
        pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_40,(ulong)OFFSET);
        iVar3 = Am_Value::operator_cast_to_int(pAVar5);
        Am_Object::~Am_Object(local_40);
      }
      Am_Value_List::~Am_Value_List(local_30);
    }
  }
  else {
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_38,(ulong)OFFSET);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_38,(ulong)CHILDREN);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    iVar3 = iVar3 + iVar2;
  }
  Am_Object::~Am_Object(local_38);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, calc_offset)
{
  Am_Object prev_child = self.Get(PREV_CHILD);
  if (prev_child.Valid()) {
    int prev_offset = prev_child.Get(OFFSET);
    int prev_children = prev_child.Get(CHILDREN);
    return prev_offset + prev_children;
  } else {
    int rank = self.Get(Am_RANK);
    int parent_rank = self.Get(PARENT);
    if (rank == parent_rank)
      return 0;
    Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
    if (nodes.Valid()) {
      Am_Object parent = nodes.Get_Nth(parent_rank);
      return parent.Get(OFFSET);
    } else
      return 0;
  }
}